

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommentPdu.cpp
# Opt level: O2

void __thiscall DIS::CommentPdu::unmarshal(CommentPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  FixedDatum x;
  VariableDatum local_60;
  
  SimulationManagementFamilyPdu::unmarshal(&this->super_SimulationManagementFamilyPdu,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfFixedDatumRecords);
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatumRecords);
  std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::clear(&this->_fixedDatums);
  for (uVar1 = 0; uVar1 < this->_numberOfFixedDatumRecords; uVar1 = uVar1 + 1) {
    FixedDatum::FixedDatum((FixedDatum *)&local_60);
    FixedDatum::unmarshal((FixedDatum *)&local_60,dataStream);
    std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::push_back
              (&this->_fixedDatums,(value_type *)&local_60);
    FixedDatum::~FixedDatum((FixedDatum *)&local_60);
  }
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatums);
  for (uVar1 = 0; uVar1 < this->_numberOfVariableDatumRecords; uVar1 = uVar1 + 1) {
    VariableDatum::VariableDatum(&local_60);
    VariableDatum::unmarshal(&local_60,dataStream);
    std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
              (&this->_variableDatums,&local_60);
    VariableDatum::~VariableDatum(&local_60);
  }
  return;
}

Assistant:

void CommentPdu::unmarshal(DataStream& dataStream)
{
    SimulationManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _numberOfFixedDatumRecords;
    dataStream >> _numberOfVariableDatumRecords;

     _fixedDatums.clear();
     for(size_t idx = 0; idx < _numberOfFixedDatumRecords; idx++)
     {
        FixedDatum x;
        x.unmarshal(dataStream);
        _fixedDatums.push_back(x);
     }

     _variableDatums.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatums.push_back(x);
     }
}